

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

void __thiscall AActor::AdjustFloorClip(AActor *this)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  FTerrainDef *pFVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double clip;
  sector_t_conflict *local_50;
  sector_t *hsec;
  DVector3 pos;
  msecnode_t *m;
  double shallowestclip;
  double oldclip;
  AActor *local_10;
  AActor *this_local;
  
  local_10 = this;
  TFlags<ActorFlag3,_unsigned_int>::operator&
            ((TFlags<ActorFlag3,_unsigned_int> *)((long)&oldclip + 4),
             (int)this + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_DONTSPLASH|MF3_NORADIUSDMG));
  uVar3 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&oldclip + 4));
  if (uVar3 == 0) {
    dVar8 = this->Floorclip;
    m = (msecnode_t *)0x41dfffffffc00000;
    uVar3 = TArray<F3DFloor_*,_F3DFloor_*>::Size
                      ((TArray<F3DFloor_*,_F3DFloor_*> *)&this->Sector->e->XFloor);
    if (uVar3 != 0) {
      dVar6 = Z(this);
      dVar7 = secplane_t::ZatPoint(&this->Sector->floorplane,this);
      if (dVar7 < dVar6) {
        this->Floorclip = 0.0;
      }
    }
    for (pos.Z = (double)this->touching_sectorlist; pos.Z != 0.0;
        pos.Z = *(double *)((long)pos.Z + 0x18)) {
      PosRelative((DVector3 *)&hsec,this,*(sector_t **)pos.Z);
      local_50 = sector_t::GetHeightSec(*(sector_t **)pos.Z);
      bVar2 = false;
      if (local_50 == (sector_t_conflict *)0x0) {
        lVar1 = *(long *)pos.Z;
        TVector2<double>::TVector2((TVector2<double> *)&clip,(TVector3<double> *)&hsec);
        dVar6 = secplane_t::ZatPoint((secplane_t *)(lVar1 + 0xb0),(DVector2 *)&clip);
        dVar7 = Z(this);
        bVar2 = dVar6 == dVar7;
      }
      if (bVar2) {
        iVar4 = sector_t::GetTerrain(*(sector_t **)pos.Z,0);
        pFVar5 = TArray<FTerrainDef,_FTerrainDef>::operator[](&Terrains,(long)iVar4);
        if (pFVar5->FootClip < (double)m) {
          m = (msecnode_t *)pFVar5->FootClip;
        }
      }
    }
    if (((double)m != 2147483647.0) || (NAN((double)m))) {
      this->Floorclip = (double)m;
    }
    else {
      this->Floorclip = 0.0;
    }
    if (((this->player != (player_t *)0x0) && (this->player->mo == (APlayerPawn *)this)) &&
       ((dVar8 != this->Floorclip || (NAN(dVar8) || NAN(this->Floorclip))))) {
      this->player->viewheight = this->player->viewheight - (dVar8 - this->Floorclip);
      dVar8 = player_t::GetDeltaViewHeight(this->player);
      this->player->deltaviewheight = dVar8;
    }
  }
  return;
}

Assistant:

void AActor::AdjustFloorClip ()
{
	if (flags3 & MF3_SPECIALFLOORCLIP)
	{
		return;
	}

	double oldclip = Floorclip;
	double shallowestclip = INT_MAX;
	const msecnode_t *m;

	// possibly standing on a 3D-floor
	if (Sector->e->XFloor.ffloors.Size() && Z() > Sector->floorplane.ZatPoint(this)) Floorclip = 0;

	// [RH] clip based on shallowest floor player is standing on
	// If the sector has a deep water effect, then let that effect
	// do the floorclipping instead of the terrain type.
	for (m = touching_sectorlist; m; m = m->m_tnext)
	{
		DVector3 pos = PosRelative(m->m_sector);
		sector_t *hsec = m->m_sector->GetHeightSec();
		if (hsec == NULL && m->m_sector->floorplane.ZatPoint (pos) == Z())
		{
			double clip = Terrains[m->m_sector->GetTerrain(sector_t::floor)].FootClip;
			if (clip < shallowestclip)
			{
				shallowestclip = clip;
			}
		}
	}
	if (shallowestclip == INT_MAX)
	{
		Floorclip = 0;
	}
	else
	{
		Floorclip = shallowestclip;
	}
	if (player && player->mo == this && oldclip != Floorclip)
	{
		player->viewheight -= (oldclip - Floorclip);
		player->deltaviewheight = player->GetDeltaViewHeight();
	}
}